

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O1

void avro::codec_traits<umu::r1>::decode(Decoder *d,r1 *v)

{
  long *plVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fo;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  plVar1 = (long *)__dynamic_cast(d,&Decoder::typeinfo,&ResolvingDecoder::typeinfo,0);
  if (plVar1 != (long *)0x0) {
    __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
          (**(code **)(*plVar1 + 0xb8))(plVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__x);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar2 = local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (*puVar2 == 1) {
          codec_traits<umu::_union_map_union_Union__1__>::decode(d,&v->val);
        }
        else if (*puVar2 == 0) {
          codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::decode(d,&v->id);
        }
        puVar2 = puVar2 + 1;
      } while (puVar2 != local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  codec_traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  decode(d,&v->id);
  codec_traits<umu::_union_map_union_Union__1__>::decode(d,&v->val);
  return;
}

Assistant:

static void decode(Decoder& d, umu::r1& v) {
        if (avro::ResolvingDecoder *rd =
            dynamic_cast<avro::ResolvingDecoder *>(&d)) {
            const std::vector<size_t> fo = rd->fieldOrder();
            for (std::vector<size_t>::const_iterator it = fo.begin();
                it != fo.end(); ++it) {
                switch (*it) {
                case 0:
                    avro::decode(d, v.id);
                    break;
                case 1:
                    avro::decode(d, v.val);
                    break;
                default:
                    break;
                }
            }
        } else {
            avro::decode(d, v.id);
            avro::decode(d, v.val);
        }
    }